

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transient-hostkey-cache.c
# Opt level: O1

void ssh_transient_hostkey_cache_add(ssh_transient_hostkey_cache *thc,ssh_key *key)

{
  void *e;
  undefined8 *e_00;
  strbuf *psVar1;
  undefined8 *puVar2;
  
  e = find234(thc->cache,key->vt,ssh_transient_hostkey_cache_find);
  if (e != (void *)0x0) {
    del234(thc->cache,e);
    strbuf_free(*(strbuf **)((long)e + 8));
    safefree(e);
  }
  e_00 = (undefined8 *)safemalloc(1,0x10,0);
  *e_00 = key->vt;
  psVar1 = strbuf_new();
  e_00[1] = psVar1;
  (*key->vt->public_blob)(key,psVar1->binarysink_);
  puVar2 = (undefined8 *)add234(thc->cache,e_00);
  if (puVar2 == e_00) {
    return;
  }
  __assert_fail("retd == ent",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/transient-hostkey-cache.c"
                ,0x59,
                "void ssh_transient_hostkey_cache_add(ssh_transient_hostkey_cache *, ssh_key *)");
}

Assistant:

void ssh_transient_hostkey_cache_add(
    ssh_transient_hostkey_cache *thc, ssh_key *key)
{
    struct ssh_transient_hostkey_cache_entry *ent, *retd;

    if ((ent = find234(thc->cache, (void *)ssh_key_alg(key),
                       ssh_transient_hostkey_cache_find)) != NULL) {
        del234(thc->cache, ent);
        strbuf_free(ent->pub_blob);
        sfree(ent);
    }

    ent = snew(struct ssh_transient_hostkey_cache_entry);
    ent->alg = ssh_key_alg(key);
    ent->pub_blob = strbuf_new();
    ssh_key_public_blob(key, BinarySink_UPCAST(ent->pub_blob));
    retd = add234(thc->cache, ent);
    assert(retd == ent);
}